

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

bool Utils::compareClsidType(vector<unsigned_int,_std::allocator<unsigned_int>_> *vec,string *clsid)

{
  value_type vVar1;
  reference pvVar2;
  long lVar3;
  char *pcVar4;
  int local_28;
  int i;
  int j;
  string *clsid_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *vec_local;
  
  local_28 = 0;
  do {
    if (0xf < local_28) {
      return true;
    }
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (vec,(long)local_28);
    if ((*pvVar2 != 0) ||
       ((lVar3 = std::__cxx11::string::size(), lVar3 != 0xf &&
        (lVar3 = std::__cxx11::string::size(), lVar3 != 0xe)))) {
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (vec,(long)local_28);
      vVar1 = *pvVar2;
      pcVar4 = (char *)std::__cxx11::string::at((ulong)clsid);
      if ((char)vVar1 != *pcVar4) {
        return false;
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

bool Utils::compareClsidType(std::vector<unsigned int> vec, std::string clsid) {
    int j = 0;      // Used for cases when clsid contains \x00 -> I remove all \x00 from clsid-s and it's len = 15 or 14

    for(int i = 0 ; i < 16; ++i) {
        if((vec[i] == 0x00) && (clsid.size() == 15 || clsid.size() == 14))
            continue;

        if((char)vec[i] != (char)clsid.at(j))
            return false;

        ++j;
    }
    return true;
}